

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O3

bool __thiscall tinygltf::Accessor::operator==(Accessor *this,Accessor *other)

{
  bool bVar1;
  __type _Var2;
  
  if (this->bufferView != other->bufferView) {
    return false;
  }
  if ((((((this->byteOffset == other->byteOffset) && (this->componentType == other->componentType))
        && (this->count == other->count)) &&
       (((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
         (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count &&
        (bVar1 = std::__equal<false>::
                 equal<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>,std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,tinygltf::Value>>>
                           ((this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                            (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>
                             )&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
                            (other->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                           ), bVar1)))) &&
      ((bVar1 = Equals(&this->extras,&other->extras), bVar1 &&
       ((bVar1 = Equals((vector<double,_std::allocator<double>_> *)
                        (this->maxValues).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (vector<double,_std::allocator<double>_> *)
                        (this->maxValues).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish), bVar1 &&
        (bVar1 = Equals((vector<double,_std::allocator<double>_> *)
                        (this->minValues).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (vector<double,_std::allocator<double>_> *)
                        (this->minValues).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish), bVar1)))))) &&
     ((_Var2 = std::operator==(&this->name,&other->name), _Var2 &&
      (this->normalized == other->normalized)))) {
    return this->type == other->type;
  }
  return false;
}

Assistant:

bool Accessor::operator==(const Accessor &other) const {
  return this->bufferView == other.bufferView &&
         this->byteOffset == other.byteOffset &&
         this->componentType == other.componentType &&
         this->count == other.count && this->extensions == other.extensions &&
         this->extras == other.extras &&
         Equals(this->maxValues, other.maxValues) &&
         Equals(this->minValues, other.minValues) && this->name == other.name &&
         this->normalized == other.normalized && this->type == other.type;
}